

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

int __thiscall QPDFWriter::openObject(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  long lVar2;
  string *psVar3;
  size_type sVar4;
  uint __val;
  uint uVar5;
  NewObject *pNVar6;
  uint uVar7;
  size_type *psVar8;
  size_t __n;
  size_t idx;
  uint __len;
  string __str;
  long *local_50;
  void *local_48;
  long local_40 [2];
  
  if (objid == 0) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    objid = peVar1->next_objid;
    peVar1->next_objid = objid + 1;
  }
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                    super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                    super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                    ._M_impl;
  psVar3 = peVar1->pipeline->str;
  psVar8 = (size_type *)&peVar1->pipeline->count;
  if (psVar3 != (string *)0x0) {
    psVar8 = &psVar3->_M_string_length;
  }
  sVar4 = *psVar8;
  idx = (size_t)objid;
  __n = (long)*(pointer *)
               ((long)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                       super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                       super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
               + 8) - lVar2 >> 5;
  if (idx < __n) {
    pNVar6 = (NewObject *)(lVar2 + idx * 0x20);
  }
  else {
    pNVar6 = ObjTable<QPDFWriter::NewObject>::large_element
                       (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,idx);
  }
  (pNVar6->xref).type = 1;
  (pNVar6->xref).field1 = sVar4;
  (pNVar6->xref).field2 = 0;
  __val = -objid;
  if (0 < objid) {
    __val = objid;
  }
  __len = 1;
  if (9 < __val) {
    __n = (size_t)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar7 = (uint)__n;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_001ea05b;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_001ea05b;
      }
      if (uVar7 < 10000) goto LAB_001ea05b;
      __n = __n / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_001ea05b:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(objid >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)objid >> 0x1f) + (long)local_50),__len,__val);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_50,local_48,__n);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27d87a,(void *)0x7,__n);
  return objid;
}

Assistant:

int
QPDFWriter::openObject(int objid)
{
    if (objid == 0) {
        objid = m->next_objid++;
    }
    m->new_obj[objid].xref = QPDFXRefEntry(m->pipeline->getCount());
    writeString(std::to_string(objid));
    writeString(" 0 obj\n");
    return objid;
}